

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::replace(QByteArray *this,char before,char after)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  QArrayDataPointer<char> *pQVar4;
  char in_DL;
  char *__result;
  char in_SIL;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  char *dst;
  qsizetype pos;
  QByteArray tmp;
  undefined4 in_stack_ffffffffffffff98;
  Initialization in_stack_ffffffffffffff9c;
  QArrayDataPointer<char> *in_stack_ffffffffffffffa0;
  QByteArray *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  QArrayDataPointer<char> local_28;
  char local_a;
  char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_SIL != in_DL) &&
     (pQVar4 = in_RDI, local_a = in_DL,
     pcVar2 = (char *)indexOf(in_stack_ffffffffffffffa8,
                              (char)((ulong)in_stack_ffffffffffffffa0 >> 0x38),
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
     -1 < (long)pcVar2)) {
    bVar1 = QArrayDataPointer<char>::needsDetach(in_stack_ffffffffffffffa0);
    if (bVar1) {
      local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_28.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      size((QByteArray *)in_RDI);
      QByteArray(in_stack_ffffffffffffffa8,(qsizetype)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c);
      QArrayDataPointer<char>::data(&local_28);
      pcVar3 = QArrayDataPointer<char>::data(in_RDI);
      QArrayDataPointer<char>::data(in_RDI);
      pcVar3 = std::copy<char*,char*>
                         (in_stack_ffffffffffffffb0,pcVar3,(char *)in_stack_ffffffffffffffa0);
      __result = pcVar3 + 1;
      *pcVar3 = local_a;
      pcVar3 = QArrayDataPointer<char>::data(in_RDI);
      pcVar3 = pcVar3 + (long)pcVar2 + 1;
      QArrayDataPointer<char>::end(in_stack_ffffffffffffffa0);
      std::replace_copy<char*,char*,char>((char *)pQVar4,pcVar2,__result,(char *)in_RDI,pcVar3);
      swap((QByteArray *)in_stack_ffffffffffffffa0,
           (QByteArray *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      ~QByteArray((QByteArray *)0x1c1bea);
    }
    else {
      pcVar3 = QArrayDataPointer<char>::data(in_RDI);
      pcVar3[(long)pcVar2] = local_a;
      pcVar3 = QArrayDataPointer<char>::data(in_RDI);
      pQVar4 = (QArrayDataPointer<char> *)(pcVar3 + (long)pcVar2 + 1);
      pcVar2 = QArrayDataPointer<char>::end(pQVar4);
      std::replace<char*,char>((char *)pQVar4,pcVar2,&local_9,&local_a);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray &QByteArray::replace(char before, char after)
{
    if (before != after) {
        if (const auto pos = indexOf(before); pos >= 0) {
            if (d.needsDetach()) {
                QByteArray tmp(size(), Qt::Uninitialized);
                auto dst = tmp.d.data();
                dst = std::copy(d.data(), d.data() + pos, dst);
                *dst++ = after;
                std::replace_copy(d.data() + pos + 1, d.end(), dst, before, after);
                swap(tmp);
            } else {
                // in-place
                d.data()[pos] = after;
                std::replace(d.data() + pos + 1, d.end(), before, after);
            }
        }
    }
    return *this;
}